

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

history_chart * findchart(history_chart *hs,uint idx)

{
  history_chart *phStack_10;
  uint idx_local;
  history_chart *hs_local;
  
  for (phStack_10 = hs; (phStack_10 != (history_chart *)0x0 && (phStack_10->idx != idx));
      phStack_10 = phStack_10->next) {
  }
  return phStack_10;
}

Assistant:

static struct history_chart *findchart(struct history_chart *hs,
									   unsigned int idx) {
	for (; hs; hs = hs->next)
		if (hs->idx == idx)
			break;
	return hs;
}